

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollController.cpp
# Opt level: O0

void __thiscall
Rml::ScrollController::UpdateAutoscroll
          (ScrollController *this,Vector2i mouse_position,float dp_ratio)

{
  code *pcVar1;
  bool bVar2;
  float fVar3;
  Vector2<float> local_60;
  Vector2f local_58;
  Vector2f scroll_length_integral;
  Vector2f local_40;
  Vector2f scroll_velocity;
  Vector2<int> local_30;
  Vector2<float> local_28;
  Vector2f scroll_delta;
  float dt;
  float dp_ratio_local;
  ScrollController *this_local;
  Vector2i mouse_position_local;
  
  scroll_delta.y = dp_ratio;
  this_local = (ScrollController *)mouse_position;
  if (((this->mode != Autoscroll) || (this->target == (Element *)0x0)) &&
     (bVar2 = Assert("RMLUI_ASSERT(mode == Mode::Autoscroll && target)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ScrollController.cpp"
                     ,0x8a), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  scroll_delta.x = UpdateTime(this);
  scroll_velocity.x = (float)(this->autoscroll_start_position).x;
  scroll_velocity.y = (float)(this->autoscroll_start_position).y;
  local_30 = Vector2<int>::operator-((Vector2<int> *)&this_local,(Vector2<int>)scroll_velocity);
  local_28 = Vector2::operator_cast_to_Vector2((Vector2 *)&local_30);
  local_40 = CalculateAutoscrollVelocity(local_28,scroll_delta.y);
  scroll_length_integral = Vector2<float>::operator*(&local_40,scroll_delta.x);
  Vector2<float>::operator+=(&this->autoscroll_accumulated_length,scroll_length_integral);
  local_58 = this->autoscroll_accumulated_length;
  fVar3 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).x,&local_58.x);
  (this->autoscroll_accumulated_length).x = fVar3;
  fVar3 = Math::DecomposeFractionalIntegral((this->autoscroll_accumulated_length).y,&local_58.y);
  (this->autoscroll_accumulated_length).y = fVar3;
  Vector2<float>::Vector2(&local_60,0.0);
  bVar2 = Vector2<float>::operator!=(&local_40,local_60);
  if (bVar2) {
    this->autoscroll_moved = true;
  }
  PerformScrollOnTarget(this,local_58);
  return;
}

Assistant:

void ScrollController::UpdateAutoscroll(Vector2i mouse_position, float dp_ratio)
{
	RMLUI_ASSERT(mode == Mode::Autoscroll && target);

	const float dt = UpdateTime();

	const Vector2f scroll_delta = Vector2f(mouse_position - autoscroll_start_position);
	const Vector2f scroll_velocity = CalculateAutoscrollVelocity(scroll_delta, dp_ratio);

	autoscroll_accumulated_length += scroll_velocity * dt;

	// Only submit the integer part of the scroll length, accumulate and store fractional parts to enable sub-pixel-per-frame scrolling speeds.
	Vector2f scroll_length_integral = autoscroll_accumulated_length;
	autoscroll_accumulated_length.x = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.x, &scroll_length_integral.x);
	autoscroll_accumulated_length.y = Math::DecomposeFractionalIntegral(autoscroll_accumulated_length.y, &scroll_length_integral.y);

	if (scroll_velocity != Vector2f(0.f))
		autoscroll_moved = true;

	PerformScrollOnTarget(scroll_length_integral);
}